

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O2

void __thiscall
QMimeMagicRule::QMimeMagicRule
          (QMimeMagicRule *this,QString *type,QByteArray *value,QString *offsets,QByteArray *mask,
          QString *errorString)

{
  byte *pbVar1;
  QByteArray *this_00;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  qsizetype qVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  Data *pDVar8;
  bool bVar9;
  Type TVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  qsizetype qVar14;
  byte *pbVar15;
  code *pcVar16;
  byte bVar17;
  uint uVar18;
  __off_t __length;
  byte *pbVar19;
  QString *pQVar20;
  uint uVar21;
  char *pcVar22;
  byte *pbVar23;
  byte *pbVar24;
  long in_FS_OFFSET;
  QStringView n;
  QByteArrayView bv;
  QStringView QVar25;
  QStringView QVar26;
  bool ok;
  undefined7 uStack_a7;
  char16_t *pcStack_a0;
  qsizetype local_98;
  QArrayDataPointer<char16_t> local_88;
  QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_subMatches).d.d = (Data *)0x0;
  (this->m_subMatches).d.ptr = (QMimeMagicRule *)0x0;
  (this->m_subMatches).d.size = 0;
  pQVar20 = (QString *)mask;
  QString::toLatin1_helper((QByteArray *)&local_68,type);
  TVar10 = QMimeMagicRule::type((QByteArray *)&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
  this->m_type = TVar10;
  QArrayDataPointer<char>::QArrayDataPointer(&(this->m_value).d,&value->d);
  this_00 = &this->m_mask;
  QArrayDataPointer<char>::QArrayDataPointer(&this_00->d,&mask->d);
  (this->m_pattern).d.size = 0;
  (this->m_pattern).d.d = (Data *)0x0;
  (this->m_pattern).d.ptr = (char *)0x0;
  this->m_matchFunction = 0;
  *(undefined8 *)&this->field_0x80 = 0;
  if (this->m_type == Invalid) {
    if (errorString == (QString *)0x0) goto switchD_00446a55_default;
    local_68.a.a.m_size = 5;
    local_68.a.a.m_data = "Type ";
    local_68.b.m_size = 0x11;
    local_68.b.m_data = " is not supported";
    local_68.a.b = type;
    QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>::
    convertTo<QString>((QString *)&local_88,&local_68);
    pDVar8 = (errorString->d).d;
    pcVar7 = (errorString->d).ptr;
    (errorString->d).d = local_88.d;
    (errorString->d).ptr = local_88.ptr;
    qVar14 = (errorString->d).size;
    (errorString->d).size = local_88.size;
    local_88.d = pDVar8;
    local_88.ptr = pcVar7;
    local_88.size = qVar14;
LAB_00446f88:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    goto switchD_00446a55_default;
  }
  qVar14 = QString::indexOf(offsets,(QChar)0x3a,0,CaseSensitive);
  local_68.a.a.m_data = (char *)(offsets->d).ptr;
  local_68.a.a.m_size = (offsets->d).size;
  QVar25 = QStringView::mid((QStringView *)&local_68,0,qVar14);
  local_68.a.a.m_data = (char *)(offsets->d).ptr;
  local_68.a.a.m_size = (offsets->d).size;
  QVar26 = QStringView::mid((QStringView *)&local_68,qVar14 + 1,-1);
  n.m_data = (storage_type_conflict *)&this->m_startPos;
  n.m_size = (qsizetype)QVar25.m_data;
  bVar9 = QMimeTypeParserBase::parseNumber
                    ((QMimeTypeParserBase *)QVar25.m_size,n,(int *)errorString,pQVar20);
  if ((!bVar9) ||
     (QVar25.m_data = (storage_type_conflict *)&this->m_endPos,
     QVar25.m_size = (qsizetype)QVar26.m_data,
     bVar9 = QMimeTypeParserBase::parseNumber
                       ((QMimeTypeParserBase *)QVar26.m_size,QVar25,(int *)errorString,pQVar20),
     !bVar9)) {
    this->m_type = Invalid;
    goto switchD_00446a55_default;
  }
  if ((this->m_value).d.size == 0) {
    this->m_type = Invalid;
    if (errorString == (QString *)0x0) goto switchD_00446a55_default;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    local_68.a.a.m_size = (qsizetype)(errorString->d).d;
    local_68.a.a.m_data = (char *)(errorString->d).ptr;
    (errorString->d).d = (Data *)0x0;
    (errorString->d).ptr = L"Invalid empty magic rule value";
    local_68.a.b = (QString *)(errorString->d).size;
    (errorString->d).size = 0x1e;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    goto LAB_00446f88;
  }
  TVar10 = this->m_type;
  if (TVar10 - Host16 < 7) {
    _ok = (Data *)CONCAT71(uStack_a7,0xaa);
    uVar11 = QByteArray::toUInt(&this->m_value,&ok,0);
    this->m_number = uVar11;
    if (ok == false) {
      this->m_type = Invalid;
      if (errorString == (QString *)0x0) goto switchD_00446a55_default;
      local_68.b.m_size = (qsizetype)(this->m_value).d.ptr;
      local_68.a.b = (QString *)(this->m_value).d.size;
      local_68.a.a.m_size = 0x1a;
      local_68.a.a.m_data = "Invalid magic rule value \"";
      local_68.b.m_data = (char *)CONCAT62(local_68.b.m_data._2_6_,0x22);
      QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t>::convertTo<QString>
                ((QString *)&local_88,
                 (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)&local_68
                );
      pDVar8 = (errorString->d).d;
      pcVar7 = (errorString->d).ptr;
      (errorString->d).d = local_88.d;
      (errorString->d).ptr = local_88.ptr;
      qVar14 = (errorString->d).size;
      (errorString->d).size = local_88.size;
      local_88.d = pDVar8;
      local_88.ptr = pcVar7;
      local_88.size = qVar14;
      goto LAB_00446f88;
    }
    if ((this->m_mask).d.size == 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = QByteArray::toUInt(this_00,&ok,0);
    }
    this->m_numberMask = uVar11;
    TVar10 = this->m_type;
  }
  switch(TVar10) {
  case String:
    local_68.a.b = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.a.a.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.a.a.m_data = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_68,(this->m_value).d.size,Uninitialized);
    pbVar15 = (byte *)QByteArray::data((QByteArray *)&local_68);
    pcVar22 = (this->m_value).d.ptr;
    if ((byte *)pcVar22 == (byte *)0x0) {
      pcVar22 = &QByteArray::_empty;
    }
    pbVar19 = (byte *)pcVar22 + (this->m_value).d.size;
    while (pcVar22 < pbVar19) {
      pbVar23 = (byte *)pcVar22;
      bVar17 = *pcVar22;
      if (*pcVar22 == 0x5c) {
        pbVar23 = (byte *)pcVar22 + 1;
        bVar2 = ((byte *)pcVar22)[1];
        bVar17 = bVar2;
        if (pbVar23 < pbVar19) {
          if (bVar2 == 0x78) {
            uVar13 = 0;
            uVar21 = 0;
            for (pbVar23 = (byte *)pcVar22 + 2; (uVar21 < 2 && (pbVar23 < pbVar19));
                pbVar23 = pbVar23 + 1) {
              iVar12 = QtMiscUtils::fromHex((int)(char)*pbVar23);
              uVar18 = uVar13 & 0xff;
              uVar13 = uVar18 * 0x10 + iVar12;
              if (iVar12 == -1) {
                uVar13 = uVar18;
              }
              uVar21 = uVar21 + 1;
            }
            pbVar23 = pbVar23 + -1;
            bVar17 = (byte)uVar13;
          }
          else if ((bVar2 & 0xf8) == 0x30) {
            bVar17 = bVar2 - 0x30;
            pbVar1 = (byte *)pcVar22 + 2;
            if ((pbVar1 < pbVar19) && ((*pbVar1 & 0xf8) == 0x30)) {
              bVar17 = (bVar17 * '\b' + *pbVar1) - 0x30;
              pbVar24 = (byte *)pcVar22 + 3;
              pbVar23 = pbVar1;
              if ((pbVar24 < pbVar19) && (bVar2 < 0x34 && (*pbVar24 & 0xf8) == 0x30)) {
                pbVar23 = pbVar24;
                bVar17 = (bVar17 * '\b' + *pbVar24) - 0x30;
              }
            }
          }
          else if (bVar2 == 0x6e) {
            bVar17 = 10;
          }
          else if (bVar2 == 0x74) {
            bVar17 = 9;
          }
          else if (bVar2 == 0x72) {
            bVar17 = 0xd;
          }
        }
      }
      *pbVar15 = bVar17;
      pbVar15 = pbVar15 + 1;
      pcVar22 = (char *)(pbVar23 + 1);
    }
    pcVar22 = QByteArray::data((QByteArray *)&local_68);
    QByteArray::truncate((QByteArray *)&local_68,(char *)(pbVar15 + -(long)pcVar22),__length);
    pDVar6 = (this->m_pattern).d.d;
    pcVar7 = (char16_t *)(this->m_pattern).d.ptr;
    (this->m_pattern).d.d = (Data *)local_68.a.a.m_size;
    (this->m_pattern).d.ptr = local_68.a.a.m_data;
    pQVar20 = (QString *)(this->m_pattern).d.size;
    (this->m_pattern).d.size = (qsizetype)local_68.a.b;
    local_68.a.a.m_size = (qsizetype)pDVar6;
    local_68.a.a.m_data = (char *)pcVar7;
    local_68.a.b = pQVar20;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
    QByteArray::squeeze(&this->m_pattern);
    uVar3 = (this->m_mask).d.size;
    if (uVar3 != 0) {
      if (3 < uVar3) {
        qVar14 = QByteArrayView::lengthHelperCharArray("0x",3);
        bv.m_data = "0x";
        bv.m_size = qVar14;
        bVar9 = QByteArray::startsWith(this_00,bv);
        if (bVar9) {
          pcVar22 = (this->m_mask).d.ptr;
          if (pcVar22 == (char *)0x0) {
            pcVar22 = &QByteArray::_empty;
          }
          QByteArray::fromRawData((QByteArray *)&local_68,pcVar22 + 2,(this->m_mask).d.size + -2);
          QByteArray::fromHex((QByteArray *)&local_88,(QByteArray *)&local_68);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
          qVar14 = local_88.size;
          lVar4 = (this->m_pattern).d.size;
          if (local_88.size == lVar4) {
            QByteArray::operator=(this_00,(QByteArray *)&local_88);
          }
          else {
            this->m_type = Invalid;
            if (errorString != (QString *)0x0) {
              local_68.b.m_size = (qsizetype)(this->m_mask).d.ptr;
              local_68.a.b = (QString *)(this->m_mask).d.size;
              local_68.a.a.m_size = 0x1e;
              local_68.a.a.m_data = "Invalid magic rule mask size \"";
              local_68.b.m_data = (char *)CONCAT62(local_68.b.m_data._2_6_,0x22);
              QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t>::
              convertTo<QString>((QString *)&ok,
                                 (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t>
                                  *)&local_68);
              pDVar8 = (errorString->d).d;
              pcVar7 = (errorString->d).ptr;
              (errorString->d).d = _ok;
              (errorString->d).ptr = pcStack_a0;
              qVar5 = (errorString->d).size;
              (errorString->d).size = local_98;
              _ok = pDVar8;
              pcStack_a0 = pcVar7;
              local_98 = qVar5;
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ok);
            }
          }
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
          if (qVar14 != lVar4) goto switchD_00446a55_default;
          goto LAB_00446dd0;
        }
      }
      this->m_type = Invalid;
      if (errorString == (QString *)0x0) goto switchD_00446a55_default;
      local_68.b.m_size = (qsizetype)(this->m_mask).d.ptr;
      local_68.a.b = (QString *)(this->m_mask).d.size;
      local_68.a.a.m_size = 0x19;
      local_68.a.a.m_data = "Invalid magic rule mask \"";
      local_68.b.m_data = (char *)CONCAT62(local_68.b.m_data._2_6_,0x22);
      QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t>::convertTo<QString>
                ((QString *)&local_88,
                 (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)&local_68
                );
      pDVar8 = (errorString->d).d;
      pcVar7 = (errorString->d).ptr;
      (errorString->d).d = local_88.d;
      (errorString->d).ptr = local_88.ptr;
      qVar14 = (errorString->d).size;
      (errorString->d).size = local_88.size;
      local_88.d = pDVar8;
      local_88.ptr = pcVar7;
      local_88.size = qVar14;
      goto LAB_00446f88;
    }
    QByteArray::fill(this_00,-1,(this->m_pattern).d.size);
LAB_00446dd0:
    QByteArray::squeeze(this_00);
    pcVar16 = matchString;
    break;
  case Host16:
    if (0xffff < this->m_number) goto switchD_00446a55_default;
    goto LAB_00446c10;
  case Host32:
    uVar13 = this->m_numberMask;
LAB_00446c69:
    if (uVar13 == 0) goto LAB_00446c6d;
    goto LAB_00446c71;
  case Big16:
  case Little16:
    uVar13 = this->m_number;
    if (0xffff < uVar13) goto switchD_00446a55_default;
    uVar21 = (uint)(ushort)((ushort)uVar13 << 8 | (ushort)uVar13 >> 8);
    if (TVar10 == Little16) {
      uVar21 = uVar13;
    }
    this->m_number = uVar21 & 0xffff;
    uVar13 = this->m_numberMask;
    if (uVar13 != 0) {
      uVar21 = (uint)(ushort)((ushort)uVar13 << 8 | (ushort)uVar13 >> 8);
      if (TVar10 == Little16) {
        uVar21 = uVar13;
      }
      this->m_numberMask = uVar21 & 0xffff;
    }
LAB_00446c10:
    if (this->m_numberMask == 0) {
      this->m_numberMask = 0xffff;
    }
    pcVar16 = matchNumber<unsigned_short>;
    break;
  case Big32:
    uVar13 = this->m_number;
    uVar21 = this->m_numberMask;
    this->m_number =
         uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    if (uVar21 != 0) {
      uVar13 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
LAB_00446c67:
      this->m_numberMask = uVar13;
      goto LAB_00446c69;
    }
    goto LAB_00446c6d;
  case Little32:
    uVar13 = this->m_numberMask;
    if (uVar13 != 0) goto LAB_00446c67;
LAB_00446c6d:
    this->m_numberMask = 0xffffffff;
LAB_00446c71:
    pcVar16 = matchNumber<unsigned_int>;
    break;
  case Byte:
    if (0xff < this->m_number) goto switchD_00446a55_default;
    if (this->m_numberMask == 0) {
      this->m_numberMask = 0xff;
    }
    pcVar16 = matchNumber<unsigned_char>;
    break;
  default:
    goto switchD_00446a55_default;
  }
  this->m_matchFunction = (MatchFunction)pcVar16;
  *(undefined8 *)&this->field_0x80 = 0;
switchD_00446a55_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QMimeMagicRule::QMimeMagicRule(const QString &type,
                               const QByteArray &value,
                               const QString &offsets,
                               const QByteArray &mask,
                               QString *errorString)
    : m_type(QMimeMagicRule::type(type.toLatin1())),
      m_value(value),
      m_mask(mask),
      m_matchFunction(nullptr)
{
    if (Q_UNLIKELY(m_type == Invalid)) {
        if (errorString)
            *errorString = "Type "_L1 + type + " is not supported"_L1;
        return;
    }

    // Parse for offset as "1" or "1:10"
    const qsizetype colonIndex = offsets.indexOf(u':');
    const QStringView startPosStr = QStringView{offsets}.mid(0, colonIndex); // \ These decay to returning 'offsets'
    const QStringView endPosStr   = QStringView{offsets}.mid(colonIndex + 1);// / unchanged when colonIndex == -1
    if (Q_UNLIKELY(!QMimeTypeParserBase::parseNumber(startPosStr, &m_startPos, errorString)) ||
        Q_UNLIKELY(!QMimeTypeParserBase::parseNumber(endPosStr, &m_endPos, errorString))) {
        m_type = Invalid;
        return;
    }

    if (Q_UNLIKELY(m_value.isEmpty())) {
        m_type = Invalid;
        if (errorString)
            *errorString = QStringLiteral("Invalid empty magic rule value");
        return;
    }

    if (m_type >= Host16 && m_type <= Byte) {
        bool ok;
        m_number = m_value.toUInt(&ok, 0); // autodetect base
        if (Q_UNLIKELY(!ok)) {
            m_type = Invalid;
            if (errorString)
                *errorString = "Invalid magic rule value \""_L1 + QLatin1StringView(m_value) + u'"';
            return;
        }
        m_numberMask = !m_mask.isEmpty() ? m_mask.toUInt(&ok, 0) : 0; // autodetect base
    }

    switch (m_type) {
    case String:
        m_pattern = makePattern(m_value);
        m_pattern.squeeze();
        if (!m_mask.isEmpty()) {
            if (Q_UNLIKELY(m_mask.size() < 4 || !m_mask.startsWith("0x"))) {
                m_type = Invalid;
                if (errorString)
                    *errorString = "Invalid magic rule mask \""_L1 + QLatin1StringView(m_mask) + u'"';
                return;
            }
            const QByteArray &tempMask = QByteArray::fromHex(QByteArray::fromRawData(
                                                     m_mask.constData() + 2, m_mask.size() - 2));
            if (Q_UNLIKELY(tempMask.size() != m_pattern.size())) {
                m_type = Invalid;
                if (errorString)
                    *errorString = "Invalid magic rule mask size \""_L1 + QLatin1StringView(m_mask) + u'"';
                return;
            }
            m_mask = tempMask;
        } else {
            m_mask.fill(char(-1), m_pattern.size());
        }
        m_mask.squeeze();
        m_matchFunction = &QMimeMagicRule::matchString;
        break;
    case Byte:
        if (m_number <= quint8(-1)) {
            if (m_numberMask == 0)
                m_numberMask = quint8(-1);
            m_matchFunction = &QMimeMagicRule::matchNumber<quint8>;
        }
        break;
    case Big16:
    case Little16:
        if (m_number <= quint16(-1)) {
            m_number = m_type == Little16 ? qFromLittleEndian<quint16>(m_number) : qFromBigEndian<quint16>(m_number);
            if (m_numberMask != 0)
                m_numberMask = m_type == Little16 ? qFromLittleEndian<quint16>(m_numberMask) : qFromBigEndian<quint16>(m_numberMask);
        }
        Q_FALLTHROUGH();
    case Host16:
        if (m_number <= quint16(-1)) {
            if (m_numberMask == 0)
                m_numberMask = quint16(-1);
            m_matchFunction = &QMimeMagicRule::matchNumber<quint16>;
        }
        break;
    case Big32:
    case Little32:
        m_number = m_type == Little32 ? qFromLittleEndian<quint32>(m_number) : qFromBigEndian<quint32>(m_number);
        if (m_numberMask != 0)
            m_numberMask = m_type == Little32 ? qFromLittleEndian<quint32>(m_numberMask) : qFromBigEndian<quint32>(m_numberMask);
        Q_FALLTHROUGH();
    case Host32:
        if (m_numberMask == 0)
            m_numberMask = quint32(-1);
        m_matchFunction = &QMimeMagicRule::matchNumber<quint32>;
        break;
    default:
        break;
    }
}